

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::Image::printSearchPath(void)

{
  long lVar1;
  size_t sVar2;
  char *__s;
  int i;
  int iVar3;
  long lVar4;
  
  lVar1 = engine;
  lVar4 = (long)imageModuleOffset;
  __s = *(char **)(engine + lVar4);
  for (iVar3 = 0; iVar3 < *(int *)(lVar1 + 8 + lVar4); iVar3 = iVar3 + 1) {
    puts(__s);
    sVar2 = strlen(__s);
    __s = __s + sVar2 + 1;
  }
  return;
}

Assistant:

void
Image::printSearchPath(void)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	char *p = g->searchPaths;
	for(int i = 0; i < g->numSearchPaths; i++){
		printf("%s\n", p);
		p += strlen(p) + 1;
	}
}